

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

string * __thiscall
cmLocalUnixMakefileGenerator3::MaybeConvertWatcomShellCommand
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *cmd)

{
  string_view source;
  bool bVar1;
  long lVar2;
  Status local_48;
  undefined1 local_40 [8];
  string scmd;
  string *cmd_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  scmd.field_2._8_8_ = cmd;
  bVar1 = cmLocalGenerator::IsWatcomWMake((cmLocalGenerator *)this);
  if (((bVar1) && (bVar1 = cmsys::SystemTools::FileIsFullPath((string *)scmd.field_2._8_8_), bVar1))
     && (lVar2 = std::__cxx11::string::find_first_of((char *)scmd.field_2._8_8_,0xd6882c),
        lVar2 != -1)) {
    std::__cxx11::string::string((string *)local_40);
    local_48 = cmsys::SystemTools::GetShortPath((string *)scmd.field_2._8_8_,(string *)local_40);
    bVar1 = cmsys::Status::operator_cast_to_bool(&local_48);
    if (bVar1) {
      source = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (__return_storage_ptr__,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,source,SHELL);
    }
    std::__cxx11::string::~string((string *)local_40);
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::MaybeConvertWatcomShellCommand(
  std::string const& cmd)
{
  if (this->IsWatcomWMake() && cmSystemTools::FileIsFullPath(cmd) &&
      cmd.find_first_of("( )") != std::string::npos) {
    // On Watcom WMake use the windows short path for the command
    // name.  This is needed to avoid funny quoting problems on
    // lines with shell redirection operators.
    std::string scmd;
    if (cmSystemTools::GetShortPath(cmd, scmd)) {
      return this->ConvertToOutputFormat(scmd, cmOutputConverter::SHELL);
    }
  }
  return std::string();
}